

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  uchar filterType;
  byte bVar1;
  LodePNGColorType LVar2;
  uint uVar3;
  bool bVar4;
  undefined4 uVar5;
  LodePNGFilterStrategy LVar6;
  void *pvVar7;
  uchar *puVar8;
  long lVar9;
  void *pvVar10;
  long lVar11;
  uint uVar12;
  uchar *puVar13;
  ulong uVar14;
  void **outsize;
  long lVar15;
  uchar *puVar16;
  ulong uVar17;
  int iVar18;
  ulong bytewidth;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uchar *dummy;
  uchar *attempt_1 [5];
  uchar *attempt [5];
  size_t sum [5];
  uchar *local_4f0;
  ulong local_4d8;
  uchar *local_4a0;
  void *local_498 [6];
  void *local_468 [5];
  long local_440;
  LodePNGCompressSettings local_438 [21];
  ulong length;
  
  LVar2 = info->colortype;
  iVar18 = 0;
  if ((ulong)LVar2 < 7) {
    iVar18 = *(int *)(&DAT_0012b03c + (ulong)LVar2 * 4);
  }
  iVar18 = iVar18 * info->bitdepth;
  LVar6 = settings->filter_strategy;
  if (info->bitdepth < 8) {
    LVar6 = LFS_ZERO;
  }
  if (LVar2 == LCT_PALETTE) {
    LVar6 = LFS_ZERO;
  }
  if (settings->filter_palette_zero == 0) {
    LVar6 = settings->filter_strategy;
  }
  if (iVar18 == 0) {
    return 0x1f;
  }
  uVar12 = w * iVar18 + 7;
  uVar21 = uVar12 >> 3;
  length = (ulong)uVar21;
  bytewidth = (ulong)(iVar18 + 7U >> 3);
  if (LVar6 < LFS_MINSUM) {
    if (h != 0) {
      uVar23 = (ulong)h;
      puVar13 = out + 1;
      puVar16 = (uchar *)0x0;
      do {
        puVar8 = in;
        puVar13[-1] = (uchar)LVar6;
        filterScanline(puVar13,puVar8,puVar16,length,bytewidth,(uchar)LVar6);
        puVar13 = puVar13 + length + 1;
        uVar23 = uVar23 - 1;
        in = puVar8 + length;
        puVar16 = puVar8;
      } while (uVar23 != 0);
    }
LAB_0011ae9c:
    uVar12 = 0;
  }
  else {
    switch(LVar6) {
    case LFS_MINSUM:
      local_468[0] = malloc(length);
      if (local_468[0] != (void *)0x0) {
        lVar19 = 1;
LAB_0011a839:
        lVar11 = lVar19;
        if (lVar11 != 5) goto code_r0x0011a846;
        if (h != 0) {
          puVar16 = out + 1;
          uVar22 = 0;
          local_4f0 = (uchar *)0x0;
          uVar23 = 0;
          puVar13 = (uchar *)0x0;
          do {
            lVar19 = uVar22 * length;
            uVar14 = 0;
            do {
              puVar8 = (uchar *)local_468[uVar14];
              filterScanline(puVar8,in + lVar19,puVar13,length,bytewidth,(uchar)uVar14);
              *(undefined8 *)(&local_438[0].btype + uVar14 * 2) = 0;
              if (uVar14 == 0) {
                if (7 < uVar12) {
                  lVar15 = 0;
                  lVar9 = local_438[0]._0_8_;
                  do {
                    lVar9 = lVar9 + (ulong)puVar8[lVar15];
                    lVar15 = lVar15 + 1;
                  } while (uVar21 != (uint)lVar15);
                  goto LAB_0011abee;
                }
              }
              else if (7 < uVar12) {
                lVar9 = *(long *)(&local_438[0].btype + uVar14 * 2);
                lVar15 = 0;
                do {
                  bVar1 = puVar8[lVar15];
                  uVar3 = bVar1 ^ 0xff;
                  if (-1 < (char)bVar1) {
                    uVar3 = (uint)bVar1;
                  }
                  lVar9 = lVar9 + (ulong)uVar3;
                  lVar15 = lVar15 + 1;
                } while (uVar21 != (uint)lVar15);
LAB_0011abee:
                *(long *)(&local_438[0].btype + uVar14 * 2) = lVar9;
              }
              if ((uVar14 == 0) || (*(ulong *)(&local_438[0].btype + uVar14 * 2) < uVar23)) {
                uVar23 = *(ulong *)(&local_438[0].btype + uVar14 * 2);
                local_4f0 = (uchar *)(uVar14 & 0xffffffff);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != 5);
            out[(length + 1) * uVar22] = (uchar)local_4f0;
            if (7 < uVar12) {
              pvVar7 = local_468[(ulong)local_4f0 & 0xff];
              lVar9 = 0;
              do {
                puVar16[lVar9] = *(uchar *)((long)pvVar7 + lVar9);
                lVar9 = lVar9 + 1;
              } while (uVar21 != (uint)lVar9);
            }
            uVar22 = uVar22 + 1;
            puVar16 = puVar16 + length + 1;
            puVar13 = in + lVar19;
          } while (uVar22 != h);
        }
        lVar19 = 0;
        do {
          free(local_468[lVar19]);
          lVar19 = lVar19 + 1;
        } while (lVar19 != 5);
LAB_0011ae91:
        if (lVar11 != 5) {
          return 0x53;
        }
        goto LAB_0011ae9c;
      }
      break;
    case LFS_ENTROPY:
      local_498[0] = malloc(length);
      if (local_498[0] != (void *)0x0) {
        lVar19 = 1;
LAB_0011a95a:
        lVar11 = lVar19;
        if (lVar11 != 5) goto code_r0x0011a967;
        if (h != 0) {
          puVar16 = out + 1;
          uVar23 = 0;
          local_4f0 = (uchar *)0x0;
          pvVar7 = (void *)0x0;
          puVar13 = (uchar *)0x0;
          do {
            lVar19 = uVar23 * length;
            uVar22 = 0;
            do {
              puVar8 = (uchar *)local_498[uVar22];
              filterScanline(puVar8,in + lVar19,puVar13,length,bytewidth,(uchar)uVar22);
              memset(local_438,0,0x400);
              if (7 < uVar12) {
                lVar9 = 0;
                do {
                  (&local_438[0].btype)[puVar8[lVar9]] = (&local_438[0].btype)[puVar8[lVar9]] + 1;
                  lVar9 = lVar9 + 1;
                } while (uVar21 != (uint)lVar9);
              }
              (&local_438[0].btype)[uVar22] = (&local_438[0].btype)[uVar22] + 1;
              local_468[uVar22] = (void *)0x0;
              lVar9 = 0;
              pvVar10 = (void *)0x0;
              do {
                uVar3 = (&local_438[0].btype)[lVar9];
                uVar14 = (ulong)uVar3;
                if (uVar14 == 0) {
                  lVar15 = 0;
                }
                else {
                  uVar20 = (ulong)(uVar3 >> 0x10);
                  if (0xffff >= uVar3) {
                    uVar20 = uVar14;
                  }
                  lVar15 = (ulong)(0xffff < uVar3) << 4;
                  uVar17 = uVar20;
                  if (0xff < uVar20) {
                    do {
                      lVar15 = lVar15 + 8;
                      uVar20 = uVar17 >> 8;
                      bVar4 = 0xffff < uVar17;
                      uVar17 = uVar20;
                    } while (bVar4);
                  }
                  uVar17 = uVar20;
                  if (0xf < uVar20) {
                    do {
                      lVar15 = lVar15 + 4;
                      uVar20 = uVar17 >> 4;
                      bVar4 = 0xff < uVar17;
                      uVar17 = uVar20;
                    } while (bVar4);
                  }
                  if (1 < uVar20) {
                    do {
                      lVar15 = lVar15 + 1;
                      bVar4 = 3 < uVar20;
                      uVar20 = uVar20 >> 1;
                    } while (bVar4);
                  }
                  lVar15 = lVar15 * uVar14;
                }
                pvVar10 = (void *)((long)pvVar10 + lVar15);
                lVar9 = lVar9 + 1;
              } while (lVar9 != 0x100);
              local_468[uVar22] = pvVar10;
              if ((uVar22 == 0) || (pvVar7 < local_468[uVar22])) {
                pvVar7 = local_468[uVar22];
                local_4f0 = (uchar *)(uVar22 & 0xffffffff);
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 != 5);
            out[(length + 1) * uVar23] = (uchar)local_4f0;
            if (7 < uVar12) {
              pvVar10 = local_498[(long)local_4f0];
              lVar9 = 0;
              do {
                puVar16[lVar9] = *(uchar *)((long)pvVar10 + lVar9);
                lVar9 = lVar9 + 1;
              } while (uVar21 != (uint)lVar9);
            }
            uVar23 = uVar23 + 1;
            puVar16 = puVar16 + length + 1;
            puVar13 = in + lVar19;
          } while (uVar23 != h);
        }
        lVar19 = 0;
        do {
          free(local_498[lVar19]);
          lVar19 = lVar19 + 1;
        } while (lVar19 != 5);
        goto LAB_0011ae91;
      }
      break;
    case LFS_BRUTE_FORCE:
      uVar5 = (settings->zlibsettings).use_lz77;
      local_438[0].windowsize = (settings->zlibsettings).windowsize;
      local_438[0].minmatch = (settings->zlibsettings).minmatch;
      local_438[0].nicematch = (settings->zlibsettings).nicematch;
      local_438[0].lazymatching = (settings->zlibsettings).lazymatching;
      local_438[0].custom_context = (settings->zlibsettings).custom_context;
      local_438[0].use_lz77 = uVar5;
      local_438[0].btype = 1;
      local_438[0].custom_zlib =
           (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
      local_438[0].custom_deflate =
           (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
      local_498[0] = malloc(length);
      if (local_498[0] != (void *)0x0) {
        lVar19 = 1;
LAB_0011a8bb:
        lVar11 = lVar19;
        if (lVar11 != 5) goto code_r0x0011a8c8;
        local_440 = lVar11;
        if (h != 0) {
          puVar16 = out + 1;
          uVar23 = 0;
          local_4d8 = 0;
          pvVar7 = (void *)0x0;
          local_4f0 = (uchar *)0x0;
          do {
            lVar19 = uVar23 * length;
            outsize = local_468;
            uVar22 = 0;
            do {
              puVar13 = (uchar *)local_498[uVar22];
              filterScanline(puVar13,in + lVar19,local_4f0,length,bytewidth,(uchar)uVar22);
              *outsize = (void *)0x0;
              local_4a0 = (uchar *)0x0;
              if (local_438[0].custom_zlib ==
                  (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr
                   *)0x0) {
                lodepng_zlib_compress(&local_4a0,(size_t *)outsize,puVar13,length,local_438);
              }
              else {
                (*local_438[0].custom_zlib)(&local_4a0,(size_t *)outsize,puVar13,length,local_438);
              }
              free(local_4a0);
              if ((uVar22 == 0) || (*outsize < pvVar7)) {
                pvVar7 = *outsize;
                local_4d8 = uVar22 & 0xffffffff;
              }
              uVar22 = uVar22 + 1;
              outsize = outsize + 1;
            } while (uVar22 != 5);
            out[(length + 1) * uVar23] = (uchar)local_4d8;
            if (7 < uVar12) {
              pvVar10 = local_498[local_4d8];
              lVar11 = 0;
              do {
                puVar16[lVar11] = *(uchar *)((long)pvVar10 + lVar11);
                lVar11 = lVar11 + 1;
              } while (uVar21 != (uint)lVar11);
            }
            uVar23 = uVar23 + 1;
            puVar16 = puVar16 + length + 1;
            local_4f0 = in + lVar19;
          } while (uVar23 != h);
        }
        lVar11 = local_440;
        lVar19 = 0;
        do {
          free(local_498[lVar19]);
          lVar19 = lVar19 + 1;
        } while (lVar19 != 5);
        goto LAB_0011ae91;
      }
      break;
    case LFS_PREDEFINED:
      if (h != 0) {
        puVar13 = out + 1;
        uVar23 = 0;
        puVar16 = (uchar *)0x0;
        do {
          puVar8 = in;
          filterType = settings->predefined_filters[uVar23];
          puVar13[-1] = filterType;
          filterScanline(puVar13,puVar8,puVar16,length,bytewidth,filterType);
          uVar23 = uVar23 + 1;
          puVar13 = puVar13 + length + 1;
          in = puVar8 + length;
          puVar16 = puVar8;
        } while (h != uVar23);
      }
      goto LAB_0011ae9c;
    default:
      return 0x58;
    }
    uVar12 = 0x53;
  }
  return uVar12;
code_r0x0011a8c8:
  pvVar7 = malloc(length);
  local_498[lVar11] = pvVar7;
  lVar19 = lVar11 + 1;
  if (pvVar7 == (void *)0x0) goto LAB_0011ae91;
  goto LAB_0011a8bb;
code_r0x0011a967:
  pvVar7 = malloc(length);
  local_498[lVar11] = pvVar7;
  lVar19 = lVar11 + 1;
  if (pvVar7 == (void *)0x0) goto LAB_0011ae91;
  goto LAB_0011a95a;
code_r0x0011a846:
  pvVar7 = malloc(length);
  local_468[lVar11] = pvVar7;
  lVar19 = lVar11 + 1;
  if (pvVar7 == (void *)0x0) goto LAB_0011ae91;
  goto LAB_0011a839;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings) {
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7u) / 8u, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7u) / 8u;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy >= LFS_ZERO && strategy <= LFS_FOUR) {
    unsigned char type = (unsigned char)strategy;
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_MINSUM) {
    /*adaptive filtering*/
    size_t sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0) {
            for(x = 0; x != linebytes; ++x) sum[type] += (unsigned char)(attempt[type][x]);
          } else {
            for(x = 0; x != linebytes; ++x) {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest) {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_ENTROPY) {
    size_t sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t bestSum = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    for(y = 0; y != h; ++y) {
      /*try the 5 filter types*/
      for(type = 0; type != 5; ++type) {
        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x != 256; ++x) count[x] = 0;
        for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
        ++count[type]; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x != 256; ++x) {
          sum[type] += count[x] == 0 ? 0 : ilog2(count[x]) * count[x];
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] > bestSum) {
          bestType = type;
          bestSum = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_PREDEFINED) {
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_BRUTE_FORCE) {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }
    for(y = 0; y != h; ++y) /*try the 5 filter types*/ {
      for(type = 0; type != 5; ++type) {
        unsigned testsize = (unsigned)linebytes;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest) {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}